

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::SendAndClose(TCPSocket *this,string *str)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  Buffer::New((Buffer *)&stack0xffffffffffffffd8,(str->_M_dataplus)._M_p,str->_M_string_length);
  SendAndClose(this,(Ptr *)&stack0xffffffffffffffd8,0);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return;
}

Assistant:

void TCPSocket::SendAndClose(const std::string &str) {
	this->SendAndClose(Buffer::New(str),0);
}